

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O2

vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
* __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::within
          (vector<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
           *__return_storage_ptr__,KDTree<phosg::Vector2<long>,_long> *this,Vector2<long> *low,
          Vector2<long> *high)

{
  anon_union_8_2_94730018_for_Vector2<long>_1 *paVar1;
  anon_union_8_2_94730018_for_Vector2<long>_1 *paVar2;
  anon_union_8_2_94730018_for_Vector2<long>_1 *paVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  out_of_range *this_00;
  anon_union_8_2_94730018_for_Vector2<long>_1 local_98;
  anon_union_8_2_94730018_for_Vector2<long>_1 aStack_90;
  anon_union_8_2_94730018_for_Vector2<long>_1 local_88;
  deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  level_nodes;
  
  if (this->root == (Node *)0x0) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    ::std::out_of_range::out_of_range(this_00,"no such item");
    __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
  }
  ::std::
  _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
  ::_Deque_base((_Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                 *)&level_nodes);
  ::std::
  deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
  ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*const&>
            ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
              *)&level_nodes,&this->root);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<phosg::Vector2<long>,_long>,_std::allocator<std::pair<phosg::Vector2<long>,_long>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    if (level_nodes.
        super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        level_nodes.
        super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      ::std::
      _Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
      ::~_Deque_base(&level_nodes.
                      super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
                    );
      return __return_storage_ptr__;
    }
    paVar3 = (anon_union_8_2_94730018_for_Vector2<long>_1 *)
             *level_nodes.
              super__Deque_base<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
    ::std::
    deque<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*,_std::allocator<phosg::KDTree<phosg::Vector2<long>,_long>::Node_*>_>
    ::pop_front(&level_nodes);
    lVar6 = 0;
    while (lVar6 != 2) {
      paVar2 = paVar3 + lVar6;
      if ((paVar2->x < (&low->field_0)[lVar6].x) ||
         (paVar1 = &high->field_0 + lVar6, lVar6 = lVar6 + 1, paVar1->x <= paVar2->x))
      goto LAB_0010728b;
    }
    local_98 = *paVar3;
    aStack_90 = paVar3[1];
    local_88 = paVar3[6];
    ::std::
    vector<std::pair<phosg::Vector2<long>,long>,std::allocator<std::pair<phosg::Vector2<long>,long>>>
    ::emplace_back<std::pair<phosg::Vector2<long>,long>>
              ((vector<std::pair<phosg::Vector2<long>,long>,std::allocator<std::pair<phosg::Vector2<long>,long>>>
                *)__return_storage_ptr__,(pair<phosg::Vector2<long>,_long> *)&local_98);
LAB_0010728b:
    sVar4 = paVar3[2].x;
    lVar6 = paVar3[sVar4].x;
    lVar5 = (&high->field_0)[sVar4].x;
    if (((&low->field_0)[sVar4].x < lVar6) && ((Node *)paVar3[3].x != (Node *)0x0)) {
      ::std::
      deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
      ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
                ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                  *)&level_nodes,(Node **)(paVar3 + 3));
    }
    if ((lVar6 <= lVar5) && ((Node *)paVar3[4].x != (Node *)0x0)) {
      ::std::
      deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
      ::emplace_back<phosg::KDTree<phosg::Vector2<long>,long>::Node*&>
                ((deque<phosg::KDTree<phosg::Vector2<long>,long>::Node*,std::allocator<phosg::KDTree<phosg::Vector2<long>,long>::Node*>>
                  *)&level_nodes,(Node **)(paVar3 + 4));
    }
  } while( true );
}

Assistant:

typename std::vector<std::pair<CoordType, ValueType>>
KDTree<CoordType, ValueType>::within(
    const CoordType& low, const CoordType& high) const {
  if (this->root == nullptr) {
    throw std::out_of_range("no such item");
  }

  std::deque<Node*> level_nodes;
  level_nodes.emplace_back(this->root);
  std::vector<std::pair<CoordType, ValueType>> ret;
  while (!level_nodes.empty()) {
    Node* n = level_nodes.front();
    level_nodes.pop_front();

    // if this node is within the range, return it
    {
      size_t dim;
      for (dim = 0; dim < CoordType::dimensions(); dim++) {
        if ((n->pt.at(dim) < low.at(dim)) ||
            (n->pt.at(dim) >= high.at(dim))) {
          break;
        }
      }
      if (dim == CoordType::dimensions()) {
        ret.emplace_back(std::make_pair(n->pt, n->value));
      }
    }

    // if the range falls entirely on one side of the node, move down to that
    // node. otherwise, move down to both nodes
    bool low_less = (low.at(n->dim) < n->pt.at(n->dim));
    bool high_greater = (high.at(n->dim) >= n->pt.at(n->dim));
    if (low_less && n->before) {
      level_nodes.emplace_back(n->before);
    }
    if (high_greater && n->after_or_equal) {
      level_nodes.emplace_back(n->after_or_equal);
    }
  }
  return ret;
}